

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

tuple __thiscall
pybind11::make_tuple<(pybind11::return_value_policy)1,pybind11::handle&,pybind11::handle&>
          (pybind11 *this,handle *args_,handle *args__1)

{
  PyObject *pPVar1;
  undefined8 uVar2;
  handle *phVar3;
  runtime_error *this_00;
  long *plVar4;
  long *plVar5;
  long lVar6;
  array<pybind11::object,_2UL> args;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  argtypes;
  handle local_b0;
  PyObject *local_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [2];
  
  pPVar1 = args_->m_ptr;
  if (pPVar1 != (PyObject *)0x0) {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
  }
  local_b0.m_ptr = args_->m_ptr;
  pPVar1 = args__1->m_ptr;
  if (pPVar1 != (PyObject *)0x0) {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
  }
  phVar3 = &local_b0;
  local_a8 = args__1->m_ptr;
  lVar6 = 0;
  do {
    if (phVar3->m_ptr == (PyObject *)0x0) {
      type_id<pybind11::handle&>();
      type_id<pybind11::handle&>();
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_80,"make_tuple(): unable to convert argument of type \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)local_60 - lVar6));
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
      local_a0 = (long *)*plVar4;
      plVar5 = plVar4 + 2;
      if (local_a0 == plVar5) {
        local_90 = *plVar5;
        lStack_88 = plVar4[3];
        local_a0 = &local_90;
      }
      else {
        local_90 = *plVar5;
      }
      local_98 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::runtime_error::runtime_error(this_00,(string *)&local_a0);
      *(undefined ***)this_00 = &PTR__runtime_error_0015cae0;
      __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar6 = lVar6 + -0x20;
    phVar3 = phVar3 + 1;
  } while (lVar6 == -0x20);
  tuple::tuple((tuple *)this,2);
  lVar6 = 0;
  do {
    uVar2 = *(undefined8 *)((long)&local_b0.m_ptr + lVar6);
    *(undefined8 *)((long)&local_b0.m_ptr + lVar6) = 0;
    if ((*(byte *)(*(long *)(*(long *)this + 8) + 0xab) & 4) == 0) {
      __assert_fail("PyTuple_Check(result.ptr())",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Joshsora[P]kipy/dependencies/pybind11/include/pybind11/cast.h"
                    ,0x6e2,
                    "tuple pybind11::make_tuple(Args &&...) [policy = pybind11::return_value_policy::automatic_reference, Args = <pybind11::handle &, pybind11::handle &>]"
                   );
    }
    *(undefined8 *)(*(long *)this + 0x18 + lVar6) = uVar2;
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x10);
  lVar6 = 8;
  do {
    object::~object((object *)((long)&local_b0.m_ptr + lVar6));
    lVar6 = lVar6 + -8;
  } while (lVar6 != -8);
  return (object)(object)this;
}

Assistant:

tuple make_tuple(Args&&... args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            std::array<std::string, size> argtypes { {type_id<Args>()...} };
            throw cast_error("make_tuple(): unable to convert argument of type '" +
                argtypes[i] + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}